

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

Data * __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::NewChainedChunk
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t bufLengthRequested)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  Data *pDVar5;
  TrackAllocData local_60;
  Data *newChunk;
  ulong uStack_28;
  charcount_t bufLength;
  size_t size_t_length;
  size_t allocation;
  charcount_t alloc32;
  charcount_t bufLengthRequested_local;
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  allocation._4_4_ = bufLengthRequested;
  _alloc32 = this;
  allocation._0_4_ = UInt32Math::MulAdd<2u,16u>(bufLengthRequested);
  size_t_length =
       Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::GetAlignedSize
                 ((ulong)(uint32)allocation);
  uStack_28 = size_t_length - 0x10 >> 1;
  newChunk._4_4_ = (charcount_t)uStack_28;
  if ((uStack_28 & 0xffffffff) != uStack_28) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x3b,"(bufLength == size_t_length)","bufLength == size_t_length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pAVar4 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&Data::typeinfo,size_t_length,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
             ,0x3d);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_60);
  pDVar5 = (Data *)new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)pAVar4,0x3f67b0,0);
  (pDVar5->u).chained.length = newChunk._4_4_;
  (pDVar5->u).chained.next = (Data *)0x0;
  return pDVar5;
}

Assistant:

Data *NewChainedChunk(charcount_t bufLengthRequested)
        {
            CompileAssert(sizeof(charcount_t) == sizeof(uint32));

            // allocation = (bufLengthRequested * sizeof(char16) + sizeof(Data)
            charcount_t alloc32 = UInt32Math::MulAdd<sizeof(char16), sizeof(Data)>(bufLengthRequested);
            size_t allocation = TAllocator::GetAlignedSize(alloc32);
            size_t size_t_length = (allocation - sizeof(Data)) / sizeof(char16);
            charcount_t bufLength = (charcount_t)size_t_length;
            Assert(bufLength == size_t_length);

            Data *newChunk = AllocatorNewStructPlus(TAllocator, this->alloc, allocation, Data);

            newChunk->u.chained.length = bufLength;
            newChunk->u.chained.next = NULL;

            // Recycler gives zeroed memory, so rely on that instead of memsetting the tail
#if 0
            // Align memset to machine register size for perf
            bufLengthRequested &= ~(sizeof(size_t) - 1);
            memset(newChunk->u.chained.buffer + bufLengthRequested, 0, (bufLength - bufLengthRequested) * sizeof(char16));
#endif
            return newChunk;
        }